

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_object_manager.cpp
# Opt level: O2

void __thiscall sc_core::sc_object_manager::~sc_object_manager(sc_object_manager *this)

{
  _Self __tmp;
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->m_instance_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_instance_table)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (*(int *)&p_Var1[2]._M_parent == 1) {
      *(undefined8 *)(*(long *)(p_Var1 + 2) + 0x68) = 0;
    }
  }
  std::_Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>::~_Vector_base
            (&(this->m_object_stack).
              super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>_>
  ::~_Rb_tree(&(this->m_instance_table)._M_t);
  return;
}

Assistant:

sc_object_manager::~sc_object_manager()
{
    instance_table_t::iterator it;     // instance table iterator.

    for ( it = m_instance_table.begin(); it != m_instance_table.end(); it++) 
    {
        if(it->second.m_name_origin == SC_NAME_OBJECT) {
            sc_object* obj_p = static_cast<sc_object*>(it->second.m_element_p);
            obj_p->m_simc = 0;
        }
    }
}